

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O1

void __thiscall
testing::Action<void(int_const*,unsigned_int,void*,unsigned_long*,void_const*,unsigned_long)>::
Action<ProcessFileNameFreeBSD_LengthIncreasesOnEachIteration_Test::TestBody()::__0_const&,void>
          (Action<void(int_const*,unsigned_int,void*,unsigned_long*,void_const*,unsigned_long)>
           *this,anon_class_8_1_8713552d_for__M_head_impl *fun)

{
  undefined4 uVar1;
  undefined4 uVar2;
  _func_void__Any_data_ptr_int_ptr_ptr_uint_ptr_void_ptr_ptr_unsigned_long_ptr_ptr_void_ptr_ptr_unsigned_long_ptr
  *__tmp_2;
  _func_bool__Any_data_ptr__Any_data_ptr__Manager_operation *__tmp_1;
  _Any_data __tmp;
  undefined8 local_38;
  undefined8 uStack_30;
  code *local_28;
  undefined8 uStack_20;
  undefined4 local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  local_38._0_4_ = SUB84(fun->lengths,0);
  uVar1 = (undefined4)local_38;
  local_38._4_4_ = (undefined4)((ulong)fun->lengths >> 0x20);
  uVar2 = local_38._4_4_;
  local_18 = (undefined4)local_38;
  uStack_14 = local_38._4_4_;
  uStack_10 = 0;
  uStack_c = 0;
  local_38 = 0;
  uStack_30 = 0;
  *(undefined4 *)this = uVar1;
  *(undefined4 *)(this + 4) = uVar2;
  *(undefined4 *)(this + 8) = 0;
  *(undefined4 *)(this + 0xc) = 0;
  local_28 = *(code **)(this + 0x10);
  *(code **)(this + 0x10) =
       std::
       _Function_handler<void_(const_int_*,_unsigned_int,_void_*,_unsigned_long_*,_const_void_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_process_file_name.cpp:216:26)>
       ::_M_manager;
  uStack_20 = *(undefined8 *)(this + 0x18);
  *(code **)(this + 0x18) =
       std::
       _Function_handler<void_(const_int_*,_unsigned_int,_void_*,_unsigned_long_*,_const_void_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_process_file_name.cpp:216:26)>
       ::_M_invoke;
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,3);
  }
  return;
}

Assistant:

Action(G&& fun) {  // NOLINT
    Init(::std::forward<G>(fun), IsCompatibleFunctor<G>());
  }